

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  undefined1 auVar2 [8];
  undefined1 auStack_168 [8];
  int e1 [5];
  int aiStack_148 [2];
  int searchRectMin [5];
  int aiStack_128 [2];
  int searchRectMax [5];
  undefined1 auStack_108 [8];
  int e2 [5];
  undefined1 auStack_e8 [8];
  int e3 [5];
  undefined1 auStack_c8 [8];
  int e4 [5];
  undefined1 auStack_a8 [8];
  int e5 [5];
  _Vector_base<int_*,_std::allocator<int_*>_> local_88;
  undefined1 local_70 [8];
  vector<int_*,_std::allocator<int_*>_> result;
  vector<int_*,_std::allocator<int_*>_> values;
  undefined1 local_38 [8];
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  tree;
  
  local_38 = (undefined1  [8])auStack_168;
  auStack_168 = (undefined1  [8])0x100000001;
  e1[0] = 1;
  e1[1] = 1;
  e1[2] = 1;
  auStack_108 = (undefined1  [8])0x100000001;
  e2[0] = 1;
  e2[1] = 1;
  auStack_e8 = (undefined1  [8])0x200000001;
  e3[0] = 2;
  e3[1] = 2;
  e3[2] = 9;
  auStack_c8 = (undefined1  [8])0x100000001;
  e4[0] = 1;
  e4[1] = 2;
  auStack_a8 = (undefined1  [8])0x800000008;
  e5[0] = 8;
  e5[1] = 8;
  e5[2] = 8;
  result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  e2[2] = e1[2];
  e4[2] = e1[2];
  std::vector<int*,std::allocator<int*>>::emplace_back<int*>
            ((vector<int*,std::allocator<int*>> *)
             &result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int **)local_38);
  local_38 = (undefined1  [8])auStack_108;
  std::vector<int*,std::allocator<int*>>::emplace_back<int*>
            ((vector<int*,std::allocator<int*>> *)
             &result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int **)local_38);
  local_38 = (undefined1  [8])auStack_e8;
  std::vector<int*,std::allocator<int*>>::emplace_back<int*>
            ((vector<int*,std::allocator<int*>> *)
             &result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int **)local_38);
  local_38 = (undefined1  [8])auStack_c8;
  std::vector<int*,std::allocator<int*>>::emplace_back<int*>
            ((vector<int*,std::allocator<int*>> *)
             &result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int **)local_38);
  local_38 = (undefined1  [8])auStack_a8;
  std::vector<int*,std::allocator<int*>>::emplace_back<int*>
            ((vector<int*,std::allocator<int*>> *)
             &result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int **)local_38);
  std::vector<int_*,_std::allocator<int_*>_>::vector
            ((vector<int_*,_std::allocator<int_*>_> *)&local_88,
             (vector<int_*,_std::allocator<int_*>_> *)
             &result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::KDTree((KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
            *)local_38,(vector<int_*,_std::allocator<int_*>_> *)&local_88);
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base(&local_88);
  aiStack_148[0] = 0;
  aiStack_148[1] = 0;
  searchRectMin[0] = 0;
  searchRectMin[1] = 0;
  searchRectMin[2] = 0;
  aiStack_128[0] = 2;
  aiStack_128[1] = 2;
  searchRectMax[0] = 2;
  searchRectMax[1] = 2;
  searchRectMax[2] = 2;
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_70,
                   (KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                    *)local_38,aiStack_148,aiStack_128);
  poVar1 = std::operator<<((ostream *)&std::cout,"found ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," entries:");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (auVar2 = local_70;
      auVar2 != (undefined1  [8])
                result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_start; auVar2 = (undefined1  [8])((long)auVar2 + 8)) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,**(int **)auVar2);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*(int **)auVar2)[1]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*(int **)auVar2)[2]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*(int **)auVar2)[3]);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*(int **)auVar2)[4]);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
            ((_Vector_base<int_*,_std::allocator<int_*>_> *)local_70);
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::~KDTree((KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
             *)local_38);
  std::_Vector_base<int_*,_std::allocator<int_*>_>::~_Vector_base
            ((_Vector_base<int_*,_std::allocator<int_*>_> *)
             &result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return 1;
}

Assistant:

int main() {

	const int dim = 5;

	// prepare elements, five dimensional int arrays. we could also use e.g. doubles if we wanted.
	int e1[dim] = {1, 1, 1, 1, 1};
	int e2[dim] = {1, 1, 1, 1, 1};
	int e3[dim] = {1, 2, 2, 2, 9};
	int e4[dim] = {1, 1, 1, 2, 1};
	int e5[dim] = {8, 8, 8, 8, 8};

	// fill the elements into a vector
	std::vector<int*> values;
	values.push_back(e1);
	values.push_back(e2);
	values.push_back(e3);
	values.push_back(e4);
	values.push_back(e5);

	// build the tree. first template parameter is the type of the elements, second parameter is the number of dimensions
	kdtree::KDTree<int, dim> tree(values);

	// prepare search query. we search for elements whose values are between 0 and 2 on all dimensions
	int searchRectMin[5] = {0,0,0,0,0};
	int searchRectMax[5] = {2,2,2,2,2};

	// perform the search. result will contain the elements that match the query.
	std::vector<int*> result = tree.queryRectangle(searchRectMin, searchRectMax);

	// print results
	std::cout << "found " << result.size() << " entries:" << std::endl;
	for(std::vector<int*>::const_iterator it = result.begin(); it != result.end(); ++it) {
		std::cout << (*it)[0] << " " << (*it)[1] << " " << (*it)[2] << " " << (*it)[3]<< " " << (*it)[4] << std::endl;
	}

	return 1;
}